

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O3

char * do_pathnormalize(char *from,char *to)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  
  sys_unbashfilename(from,to);
  cVar3 = *to;
  pcVar1 = to;
  pcVar2 = to;
  while (cVar3 != '\0') {
    if (cVar3 == '/') {
      do {
        cVar3 = pcVar2[1];
        pcVar2 = pcVar2 + 1;
      } while (cVar3 == '/');
    }
    else {
      pcVar2 = pcVar2 + 1;
      cVar3 = *pcVar2;
    }
    pcVar1 = pcVar1 + 1;
    *pcVar1 = cVar3;
  }
  return to;
}

Assistant:

static char*do_pathnormalize(const char *from, char *to) {
    const char *rp;
    char *wp, c;
    sys_unbashfilename(from, to);
    rp=wp=to;
    while((*wp++=c=*rp++)) {
        if('/' == c) {
            while('/' == *rp++);
            rp--;
        }
    }
    return to;
}